

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::Draw<2u>(StorageMultisampleTest *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  Functions *gl;
  StorageMultisampleTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar6 + 0x78))(0x8d40,this->m_fbo_ms);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf63);
  (**(code **)(lVar6 + 0x1680))(this->m_po_ms);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glUseProgram has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf67);
  (**(code **)(lVar6 + 8))(0x84c0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glActiveTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf6b);
  (**(code **)(lVar6 + 0xb8))(0xde1,this->m_to);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glActiveTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf6e);
  pcVar1 = *(code **)(lVar6 + 0x14f0);
  uVar4 = (**(code **)(lVar6 + 0xb48))(this->m_po_ms,"texture_input");
  (*pcVar1)(uVar4,0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glUniform1i or glGetUniformLocation has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf71);
  (**(code **)(lVar6 + 0x558))(0x8ce0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glDrawBuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf75);
  (**(code **)(lVar6 + 0x538))(5,0,4);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glDrawArrays has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf79);
  (**(code **)(lVar6 + 0x78))(0x8d40,this->m_fbo_aux);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf7f);
  (**(code **)(lVar6 + 0x1680))(this->m_po_aux);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glUseProgram has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf83);
  (**(code **)(lVar6 + 8))(0x84c0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glActiveTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf87);
  (**(code **)(lVar6 + 0xb8))(0x9100,this->m_to_ms);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glActiveTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf8a);
  (**(code **)(lVar6 + 0xc0))(0,this->m_to);
  pcVar1 = *(code **)(lVar6 + 0x14f0);
  uVar4 = (**(code **)(lVar6 + 0xb48))(this->m_po_aux,"texture_input");
  (*pcVar1)(uVar4,0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glUniform1i or glGetUniformLocation has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf8f);
  (**(code **)(lVar6 + 0x558))(0x8ce0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glDrawBuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf93);
  (**(code **)(lVar6 + 0x538))(5,0,4);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glDrawArrays has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf97);
  return;
}

Assistant:

void StorageMultisampleTest::Draw<2>()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare multisample texture using draw call. */

	/* Prepare framebuffer with multisample texture. */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Use first program program. */
	gl.useProgram(m_po_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram has failed");

	/* Prepare texture to be drawn with. */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture has failed");

	gl.bindTexture(GL_TEXTURE_2D, m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture has failed");

	gl.uniform1i(gl.getUniformLocation(m_po_ms, "texture_input"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i or glGetUniformLocation has failed");

	/* Select layer. */
	gl.drawBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffer has failed");

	/* Draw. */
	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays has failed");

	/* Copy multisample texture to auxiliary texture using draw call. */

	/* Prepare framebuffer with auxiliary texture. */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Use first program program. */
	gl.useProgram(m_po_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram has failed");

	/* Prepare texture to be drawn with. */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture has failed");

	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, m_to_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture has failed");

	gl.bindTextureUnit(0, m_to);

	gl.uniform1i(gl.getUniformLocation(m_po_aux, "texture_input"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i or glGetUniformLocation has failed");

	/* Select layer. */
	gl.drawBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffer has failed");

	/* Draw. */
	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays has failed");
}